

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

ssize_t sftp_attr2bin(uchar *p,LIBSSH2_SFTP_ATTRIBUTES *attrs)

{
  ulong uVar1;
  ssize_t sVar2;
  uchar *s;
  ulong *local_20;
  
  local_20 = (ulong *)p;
  if (attrs == (LIBSSH2_SFTP_ATTRIBUTES *)0x0) {
    _libssh2_htonu32(p,0);
    sVar2 = 4;
  }
  else {
    _libssh2_store_u32((uchar **)&local_20,(uint)attrs->flags & 0xf);
    if ((attrs->flags & 1) != 0) {
      uVar1 = attrs->filesize;
      *local_20 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                  (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                  (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28
                  | uVar1 << 0x38;
      local_20 = local_20 + 1;
    }
    if ((attrs->flags & 2) != 0) {
      _libssh2_store_u32((uchar **)&local_20,(uint32_t)attrs->uid);
      _libssh2_store_u32((uchar **)&local_20,(uint32_t)attrs->gid);
    }
    if ((attrs->flags & 4) != 0) {
      _libssh2_store_u32((uchar **)&local_20,(uint32_t)attrs->permissions);
    }
    if ((attrs->flags & 8) != 0) {
      _libssh2_store_u32((uchar **)&local_20,(uint32_t)attrs->atime);
      _libssh2_store_u32((uchar **)&local_20,(uint32_t)attrs->mtime);
    }
    sVar2 = (long)local_20 - (long)p;
  }
  return sVar2;
}

Assistant:

static ssize_t
sftp_attr2bin(unsigned char *p, const LIBSSH2_SFTP_ATTRIBUTES * attrs)
{
    unsigned char *s = p;
    uint32_t flag_mask =
        LIBSSH2_SFTP_ATTR_SIZE |
        LIBSSH2_SFTP_ATTR_UIDGID |
        LIBSSH2_SFTP_ATTR_PERMISSIONS |
        LIBSSH2_SFTP_ATTR_ACMODTIME;

    /* TODO: When we add SFTP4+ functionality flag_mask can get additional
       bits */

    if(!attrs) {
        _libssh2_htonu32(s, 0);
        return 4;
    }

    _libssh2_store_u32(&s, (uint32_t)(attrs->flags & flag_mask));

    if(attrs->flags & LIBSSH2_SFTP_ATTR_SIZE) {
        _libssh2_store_u64(&s, attrs->filesize);
    }

    if(attrs->flags & LIBSSH2_SFTP_ATTR_UIDGID) {
        _libssh2_store_u32(&s, (uint32_t)attrs->uid);
        _libssh2_store_u32(&s, (uint32_t)attrs->gid);
    }

    if(attrs->flags & LIBSSH2_SFTP_ATTR_PERMISSIONS) {
        _libssh2_store_u32(&s, (uint32_t)attrs->permissions);
    }

    if(attrs->flags & LIBSSH2_SFTP_ATTR_ACMODTIME) {
        _libssh2_store_u32(&s, (uint32_t)attrs->atime);
        _libssh2_store_u32(&s, (uint32_t)attrs->mtime);
    }

    return s - p;
}